

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O0

Timer * __thiscall sznet::MinHeap<sznet::Timer>::pop(MinHeap<sznet::Timer> *this)

{
  uint uVar1;
  Timer *e;
  MinHeap<sznet::Timer> *this_local;
  
  if (this->m_size == 0) {
    this_local = (MinHeap<sznet::Timer> *)0x0;
  }
  else {
    this_local = (MinHeap<sznet::Timer> *)*this->m_ptrArr;
    uVar1 = this->m_size - 1;
    this->m_size = uVar1;
    shiftDown_(this,0,this->m_ptrArr[uVar1]);
    (((Timer *)this_local)->super_MinHeaBaseElem).min_heap_idx = -1;
  }
  return (Timer *)this_local;
}

Assistant:

T* pop()
	{
		if (m_size)
		{
			T* e = m_ptrArr[0];
			shiftDown_(0, m_ptrArr[--m_size]);
			e->min_heap_idx = -1;

			return e;
		}

		return nullptr;
	}